

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O0

MPP_RET set_regs_parameters(AvsdHalCtx_t *p_hal,HalDecTask *task)

{
  int iVar1;
  RK_U32 *pRVar2;
  RK_S32 RVar3;
  RK_U32 RVar4;
  uint uVar5;
  RK_U32 RVar6;
  byte local_86;
  byte local_85;
  RK_S32 local_84;
  RK_S32 local_80;
  RK_U32 local_70;
  RK_U32 prev_anc_type;
  RK_U32 pic_type;
  RK_U32 offset;
  RK_U32 frame_height;
  RK_U32 frame_width;
  RK_S32 tmp_3;
  RK_S32 tmp_2;
  RK_S32 tmp_1;
  RK_S32 tmp;
  RK_S32 refer1;
  RK_S32 refer0;
  RK_S32 tmp_fwd;
  RK_U32 stride;
  AvsdHalPic_t *p_work_out;
  AvsdPlusRegs_t *p_regs;
  AvsdSyntax_t *p_syn;
  MPP_RET ret;
  HalDecTask *task_local;
  AvsdHalCtx_t *p_hal_local;
  
  pRVar2 = p_hal->p_regs;
  pRVar2[2] = pRVar2[2] & 0xff7fffff | 0x800000;
  if (p_hal->work_out < 0) {
    RVar3 = get_queue_pic(p_hal);
    p_hal->work_out = RVar3;
    if (p_hal->work_out < 0) {
      _mpp_log_l(2,"hal_avsd_plus","cannot get a pic_info buffer.\n","set_regs_parameters");
      return MPP_NOK;
    }
  }
  iVar1 = p_hal->work_out;
  p_hal->pic[iVar1].slot_idx = task->output;
  p_hal->pic[iVar1].pic_code_type = (p_hal->syn).pp.picCodingType;
  p_hal->pic[iVar1].picture_distance = (p_hal->syn).pp.pictureDistance;
  set_defalut_parameters(p_hal);
  pRVar2[4] = pRVar2[4] & 0x7fffff | ((p_hal->syn).pp.horizontalSize + 0xf >> 4) << 0x17;
  pRVar2[3] = pRVar2[3] & 0xfffffff | 0xb0000000;
  if ((p_hal->syn).pp.pictureStructure == 1) {
    pRVar2[3] = pRVar2[3] & 0xff7fffff;
    pRVar2[3] = pRVar2[3] & 0xffbfffff;
    pRVar2[3] = pRVar2[3] & 0xfff7ffff;
  }
  else {
    pRVar2[3] = pRVar2[3] & 0xff7fffff | 0x800000;
    pRVar2[3] = pRVar2[3] & 0xffbfffff | 0x400000;
    if ((p_hal->syn).pp.topFieldFirst == 0) {
      pRVar2[3] = pRVar2[3] & 0xfff7ffff | (uint)(p_hal->first_field == 0) << 0x13;
    }
    else {
      pRVar2[3] = pRVar2[3] & 0xfff7ffff | (p_hal->first_field & 1) << 0x13;
    }
  }
  pRVar2[4] = pRVar2[4] & 0xfff807ff | ((p_hal->syn).pp.verticalSize + 0xf >> 4 & 0xff) << 0xb;
  pRVar2[7] = pRVar2[7] & 0xfdffffff | ((p_hal->syn).pp.verticalSize + 0xf >> 0xc & 1) << 0x19;
  if ((p_hal->syn).pp.picCodingType == 2) {
    pRVar2[3] = pRVar2[3] & 0xffdfffff | 0x200000;
  }
  else {
    pRVar2[3] = pRVar2[3] & 0xffdfffff;
  }
  pRVar2[3] = pRVar2[3] & 0xffefffff | (uint)((p_hal->syn).pp.picCodingType != 0) << 0x14;
  pRVar2[5] = pRVar2[5] & 0x3ffffff | p_hal->data_offset << 0x1d;
  p_hal->data_offset = p_hal->data_offset & 0xfffffff8;
  RVar4 = get_packet_fd(p_hal,task->input);
  pRVar2[0xc] = RVar4;
  mpp_dev_set_reg_offset(p_hal->dev,0xc,p_hal->data_offset);
  pRVar2[6] = pRVar2[6] & 0xff000000 | (p_hal->syn).bitstream_size - p_hal->data_offset & 0xffffff;
  pRVar2[3] = pRVar2[3] & 0xffffdfff | ((p_hal->syn).pp.fixedPictureQp & 1) << 0xd;
  pRVar2[6] = pRVar2[6] & 0x81ffffff | ((p_hal->syn).pp.pictureQp & 0x3f) << 0x19;
  if ((p_hal->syn).pp.profileId == 0x48) {
    pRVar2[0x2c] = pRVar2[0x2c] & 0xfbffffff | 0x4000000;
  }
  else {
    pRVar2[0x2c] = pRVar2[0x2c] & 0xfbffffff;
  }
  if ((pRVar2[0x2c] >> 0x1a & 1) != 0) {
    pRVar2[0x2c] = pRVar2[0x2c] & 0xfdffffff | ((p_hal->syn).pp.weightingQuantFlag & 1) << 0x19;
    pRVar2[0x2c] = pRVar2[0x2c] & 0xffbfffff | ((p_hal->syn).pp.aecEnable & 1) << 0x16;
    pRVar2[0x2c] = pRVar2[0x2c] & 0xffdfffff | ((p_hal->syn).pp.noForwardReferenceFlag & 1) << 0x15;
    pRVar2[0x2c] = pRVar2[0x2c] & 0xffefffff | ((p_hal->syn).pp.pbFieldEnhancedFlag & 1) << 0x14;
    if (((p_hal->syn).pp.weightingQuantFlag == 0) || ((p_hal->syn).pp.chromaQuantParamDisable != 0))
    {
      pRVar2[0x2c] = pRVar2[0x2c] & 0xfff03fff;
      pRVar2[0x2c] = pRVar2[0x2c] & 0xffffc0ff;
    }
    else {
      pRVar2[0x2c] = pRVar2[0x2c] & 0xfff03fff |
                     ((p_hal->syn).pp.chromaQuantParamDeltaCb & 0x3fU) << 0xe;
      pRVar2[0x2c] = pRVar2[0x2c] & 0xffffc0ff |
                     ((p_hal->syn).pp.chromaQuantParamDeltaCr & 0x3fU) << 8;
    }
    if ((p_hal->syn).pp.weightingQuantFlag != 0) {
      pRVar2[0x2c] = pRVar2[0x2c] & 0xfe7fffff | ((p_hal->syn).pp.weightingQuantModel & 3) << 0x17;
      pRVar2[0x2c] = pRVar2[0x2c] & 0xffffff00 | (p_hal->syn).pp.weightingQuantParam[0] & 0xff;
      pRVar2[0x2a] = pRVar2[0x2a] & 0xffffff | (p_hal->syn).pp.weightingQuantParam[1] << 0x18;
      pRVar2[0x2b] = pRVar2[0x2b] & 0xffffff | (p_hal->syn).pp.weightingQuantParam[2] << 0x18;
      pRVar2[0x2b] = pRVar2[0x2b] & 0xff00ffff |
                     ((p_hal->syn).pp.weightingQuantParam[3] & 0xff) << 0x10;
      pRVar2[0x2b] = pRVar2[0x2b] & 0xffff00ff |
                     ((p_hal->syn).pp.weightingQuantParam[4] & 0xff) << 8;
      pRVar2[0x2b] = pRVar2[0x2b] & 0xffffff00 | (p_hal->syn).pp.weightingQuantParam[5] & 0xff;
    }
  }
  if (((p_hal->syn).pp.pictureStructure == 1) || (p_hal->first_field != 0)) {
    RVar4 = get_frame_fd(p_hal,task->output);
    pRVar2[0xd] = RVar4;
  }
  else {
    RVar4 = (p_hal->syn).pp.horizontalSize;
    RVar6 = get_frame_fd(p_hal,task->output);
    pRVar2[0xd] = RVar6;
    mpp_dev_set_reg_offset(p_hal->dev,0xd,RVar4);
  }
  if (task->refer[0] < 0) {
    local_80 = task->output;
  }
  else {
    local_80 = task->refer[0];
  }
  if (task->refer[1] < 0) {
    local_84 = local_80;
  }
  else {
    local_84 = task->refer[1];
  }
  if (((p_hal->first_field == 0) && ((p_hal->syn).pp.pictureStructure == 0)) &&
     ((p_hal->syn).pp.picCodingType != 2)) {
    RVar4 = get_frame_fd(p_hal,task->output);
    pRVar2[0xe] = RVar4;
    RVar4 = get_frame_fd(p_hal,local_80);
    pRVar2[0xf] = RVar4;
    RVar4 = get_frame_fd(p_hal,local_80);
    pRVar2[0x10] = RVar4;
    RVar4 = get_frame_fd(p_hal,local_84);
    pRVar2[0x11] = RVar4;
  }
  else {
    RVar4 = get_frame_fd(p_hal,local_80);
    pRVar2[0xe] = RVar4;
    RVar4 = get_frame_fd(p_hal,local_80);
    pRVar2[0xf] = RVar4;
    RVar4 = get_frame_fd(p_hal,local_84);
    pRVar2[0x10] = RVar4;
    RVar4 = get_frame_fd(p_hal,local_84);
    pRVar2[0x11] = RVar4;
  }
  if ((p_hal->syn).pp.pictureStructure == 1) {
    if ((p_hal->syn).pp.picCodingType == 2) {
      tmp_2 = 0;
      if (-1 < p_hal->work0) {
        tmp_2 = p_hal->pic[p_hal->work0].picture_distance * 2 + (p_hal->syn).pp.pictureDistance * -2
                + 0x200 & 0x1ff;
      }
      if (tmp_2 == 0) {
        tmp_2 = 2;
      }
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff0000 | tmp_2;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff | tmp_2 << 0x10;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff0000 | (uint)(0x200 / (ulong)(long)tmp_2);
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff | (int)(0x200 / (ulong)(long)tmp_2) << 0x10;
      if ((-1 < p_hal->work1) &&
         (tmp_2 = ((p_hal->syn).pp.pictureDistance * 2 +
                  p_hal->pic[p_hal->work1].picture_distance * -2) - 0x200 & 0x1ff, tmp_2 == 0)) {
        tmp_2 = 2;
      }
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff0000 | tmp_2;
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff | tmp_2 << 0x10;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff0000 | (uint)(0x200 / (ulong)(long)tmp_2);
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff | (int)(0x200 / (ulong)(long)tmp_2) << 0x10;
      if (((-1 < p_hal->work0) && (-1 < p_hal->work1)) &&
         (tmp_2 = (p_hal->pic[p_hal->work0].picture_distance * 2 +
                  p_hal->pic[p_hal->work1].picture_distance * -2) - 0x200 & 0x1ff, tmp_2 == 0)) {
        tmp_2 = 2;
      }
      uVar5 = (uint)(0x4000 / (ulong)(long)tmp_2);
      pRVar2[0x20] = pRVar2[0x20] & 0xffff0000 | uVar5;
      pRVar2[0x20] = pRVar2[0x20] & 0xffff | uVar5 << 0x10;
      uVar5 = (uint)(0x4000 / (long)p_hal->future2prev_past_dist);
      pRVar2[0x21] = pRVar2[0x21] & 0xffff0000 | uVar5 & 0xffff;
      pRVar2[0x21] = pRVar2[0x21] & 0xffff | uVar5 << 0x10;
    }
    else {
      tmp_3 = 0;
      if (-1 < p_hal->work0) {
        tmp_3 = ((p_hal->syn).pp.pictureDistance * 2 +
                p_hal->pic[p_hal->work0].picture_distance * -2) - 0x200 & 0x1ff;
      }
      if (tmp_3 == 0) {
        tmp_3 = 2;
      }
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff0000 | tmp_3;
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff | tmp_3 << 0x10;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff0000 | (uint)(0x200 / (ulong)(long)tmp_3);
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff | (int)(0x200 / (ulong)(long)tmp_3) << 0x10;
      if ((-1 < p_hal->work1) &&
         (tmp_3 = ((p_hal->syn).pp.pictureDistance * 2 +
                  p_hal->pic[p_hal->work1].picture_distance * -2) - 0x200 & 0x1ff, tmp_3 == 0)) {
        tmp_3 = 2;
      }
      p_hal->future2prev_past_dist = tmp_3;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff0000 | tmp_3;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff | tmp_3 << 0x10;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff0000 | (uint)(0x200 / (ulong)(long)tmp_3);
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff | (int)(0x200 / (ulong)(long)tmp_3) << 0x10;
      pRVar2[0x20] = pRVar2[0x20] & 0xffff0000;
      pRVar2[0x20] = pRVar2[0x20] & 0xffff;
      pRVar2[0x21] = pRVar2[0x21] & 0xffff0000;
      pRVar2[0x21] = pRVar2[0x21] & 0xffff;
    }
  }
  else if ((p_hal->syn).pp.picCodingType == 2) {
    frame_width = 0;
    if (-1 < p_hal->work0) {
      frame_width = p_hal->pic[p_hal->work0].picture_distance * 2 +
                    (p_hal->syn).pp.pictureDistance * -2 + 0x200 & 0x1ff;
    }
    if (frame_width == 0) {
      frame_width = 2;
    }
    if (p_hal->first_field == 0) {
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff0000 | frame_width - 1 & 0xffff;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff | frame_width << 0x10;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff0000 |
                     (uint)(0x200 / (long)(int)(frame_width - 1)) & 0xffff;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff | (int)(0x200 / (ulong)(long)(int)frame_width) << 0x10;
    }
    else {
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff0000 | frame_width;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff | (frame_width + 1) * 0x10000;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff0000 | (uint)(0x200 / (ulong)(long)(int)frame_width);
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff |
                     (int)(0x200 / (ulong)(long)(int)(frame_width + 1)) << 0x10;
    }
    if ((-1 < p_hal->work1) &&
       (frame_width = ((p_hal->syn).pp.pictureDistance * 2 +
                      p_hal->pic[p_hal->work1].picture_distance * -2) - 0x200 & 0x1ff,
       frame_width == 0)) {
      frame_width = 2;
    }
    if (p_hal->first_field == 0) {
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff0000 | frame_width;
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff | (frame_width + 1) * 0x10000;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff0000 | (uint)(0x200 / (ulong)(long)(int)frame_width);
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff |
                     (int)(0x200 / (ulong)(long)(int)(frame_width + 1)) << 0x10;
    }
    else {
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff0000 | frame_width - 1 & 0xffff;
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff | frame_width << 0x10;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff0000 |
                     (uint)(0x200 / (long)(int)(frame_width - 1)) & 0xffff;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff | (int)(0x200 / (ulong)(long)(int)frame_width) << 0x10;
    }
    if (((-1 < p_hal->work0) && (-1 < p_hal->work1)) &&
       (frame_width = (p_hal->pic[p_hal->work0].picture_distance * 2 +
                      p_hal->pic[p_hal->work1].picture_distance * -2) - 0x200 & 0x1ff,
       frame_width == 0)) {
      frame_width = 2;
    }
    if (((p_hal->syn).pp.pbFieldEnhancedFlag == 0) || (p_hal->first_field != 0)) {
      if (p_hal->first_field == 0) {
        pRVar2[0x20] = pRVar2[0x20] & 0xffff0000 | 0x4000;
        pRVar2[0x20] = pRVar2[0x20] & 0xffff | (int)(0x4000 / (ulong)(long)(int)frame_width) << 0x10
        ;
        pRVar2[0x21] = pRVar2[0x21] & 0xffff0000 |
                       (uint)(0x4000 / (ulong)(long)(int)(frame_width + 1));
      }
      else {
        pRVar2[0x20] = pRVar2[0x20] & 0xffff0000 |
                       (uint)(0x4000 / (long)(int)(frame_width - 1)) & 0xffff;
        pRVar2[0x20] = pRVar2[0x20] & 0xffff | (int)(0x4000 / (ulong)(long)(int)frame_width) << 0x10
        ;
      }
      iVar1 = p_hal->future2prev_past_dist;
      if (p_hal->first_field == 0) {
        pRVar2[0x21] = pRVar2[0x21] & 0xffff | (int)(0x4000 / (long)iVar1) << 0x10;
      }
      else {
        pRVar2[0x21] = pRVar2[0x21] & 0xffff0000 | (uint)(0x4000 / (long)(iVar1 + -1)) & 0xffff;
        pRVar2[0x21] = pRVar2[0x21] & 0xffff | (int)(0x4000 / (long)iVar1) << 0x10;
      }
    }
    else {
      pRVar2[0x20] = pRVar2[0x20] & 0xffff0000 |
                     (uint)(0x4000 / (long)(int)(frame_width - 1)) & 0xffff;
      pRVar2[0x20] = pRVar2[0x20] & 0xffff | (int)(0x4000 / (ulong)(long)(int)frame_width) << 0x10;
      iVar1 = p_hal->future2prev_past_dist;
      pRVar2[0x21] = pRVar2[0x21] & 0xffff0000 | (uint)(0x4000 / (long)(iVar1 + -1)) & 0xffff;
      pRVar2[0x21] = pRVar2[0x21] & 0xffff | (int)(0x4000 / (long)iVar1) << 0x10;
    }
  }
  else {
    frame_height = 0;
    if (-1 < p_hal->work0) {
      frame_height = ((p_hal->syn).pp.pictureDistance * 2 +
                     p_hal->pic[p_hal->work0].picture_distance * -2) - 0x200 & 0x1ff;
    }
    if (frame_height == 0) {
      frame_height = 2;
    }
    if (p_hal->first_field == 0) {
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff0000 | 1;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff0000 | frame_height + 1;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff0000 | 0x200;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff0000 |
                     (uint)(0x200 / (ulong)(long)(int)(frame_height + 1));
    }
    else {
      pRVar2[0x1e] = pRVar2[0x1e] & 0xffff0000 | frame_height - 1 & 0xffff;
      pRVar2[0x1c] = pRVar2[0x1c] & 0xffff0000 |
                     (uint)(0x200 / (long)(int)(frame_height - 1)) & 0xffff;
    }
    pRVar2[0x1e] = pRVar2[0x1e] & 0xffff | frame_height << 0x10;
    pRVar2[0x1c] = pRVar2[0x1c] & 0xffff | (int)(0x200 / (ulong)(long)(int)frame_height) << 0x10;
    if ((-1 < p_hal->work1) &&
       (frame_height = ((p_hal->syn).pp.pictureDistance * 2 +
                       p_hal->pic[p_hal->work1].picture_distance * -2) - 0x200 & 0x1ff,
       frame_height == 0)) {
      frame_height = 2;
    }
    p_hal->future2prev_past_dist = frame_height;
    if (p_hal->first_field == 0) {
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff | frame_height << 0x10;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff | (int)(0x200 / (ulong)(long)(int)frame_height) << 0x10;
    }
    else {
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff0000 | frame_height - 1 & 0xffff;
      pRVar2[0x1f] = pRVar2[0x1f] & 0xffff | frame_height << 0x10;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff0000 |
                     (uint)(0x200 / (long)(int)(frame_height - 1)) & 0xffff;
      pRVar2[0x1d] = pRVar2[0x1d] & 0xffff | (int)(0x200 / (ulong)(long)(int)frame_height) << 0x10;
    }
    pRVar2[0x20] = pRVar2[0x20] & 0xffff0000;
    pRVar2[0x20] = pRVar2[0x20] & 0xffff;
    pRVar2[0x21] = pRVar2[0x21] & 0xffff0000;
    pRVar2[0x21] = pRVar2[0x21] & 0xffff;
  }
  if ((pRVar2[0x2c] >> 0x1a & 1) != 0) {
    pRVar2[0x2a] = pRVar2[0x2a] & 0xff1fffff;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xffe3ffff;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xfffc7fff;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xffff8fff;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xfffff1ff;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xfffffe3f;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xffffffc7;
    pRVar2[0x2a] = pRVar2[0x2a] & 0xfffffff8;
    if (((p_hal->syn).pp.pictureStructure == 0) && ((p_hal->syn).pp.picCodingType == 2)) {
      pRVar2[0x2a] = pRVar2[0x2a] & 0xff1fffff | 0x400000;
      pRVar2[0x2a] = pRVar2[0x2a] & 0xffe3ffff;
      pRVar2[0x2a] = pRVar2[0x2a] & 0xfffc7fff | 0x10000;
      pRVar2[0x2a] = pRVar2[0x2a] & 0xffff8fff;
      if (p_hal->first_field == 0) {
        pRVar2[0x2a] = pRVar2[0x2a] & 0xfffff1ff;
        pRVar2[0x2a] = pRVar2[0x2a] & 0xfffffe3f;
        pRVar2[0x2a] = pRVar2[0x2a] & 0xffffffc7 | 0x30;
        pRVar2[0x2a] = pRVar2[0x2a] & 0xfffffff8 | 6;
      }
      else {
        pRVar2[0x2a] = pRVar2[0x2a] & 0xfffff1ff | 0x400;
        pRVar2[0x2a] = pRVar2[0x2a] & 0xfffffe3f;
        pRVar2[0x2a] = pRVar2[0x2a] & 0xffffffc7;
        pRVar2[0x2a] = pRVar2[0x2a] & 0xfffffff8;
      }
    }
  }
  pRVar2[0x30] = pRVar2[0x30] & 0x7fffff;
  pRVar2[0x30] = pRVar2[0x30] & 0xff803fff;
  pRVar2[3] = pRVar2[3] & 0xffffbfff | ((p_hal->syn).pp.loopFilterDisable & 1) << 0xe;
  pRVar2[5] = pRVar2[5] & 0xfffffc1f | ((p_hal->syn).pp.alphaOffset & 0x1fU) << 5;
  pRVar2[5] = pRVar2[5] & 0xffffffe0 | (p_hal->syn).pp.betaOffset & 0x1fU;
  pRVar2[3] = pRVar2[3] & 0xfbffffff | ((p_hal->syn).pp.skipModeFlag & 1) << 0x1a;
  pRVar2[4] = pRVar2[4] & 0xfffffffe | (p_hal->syn).pp.pictureReferenceFlag & 1;
  pRVar2[3] = pRVar2[3] & 0xffffefff;
  if ((pRVar2[0x2c] >> 0x1a & 1) == 0) {
    if (((p_hal->syn).pp.picCodingType == 1) ||
       (((p_hal->syn).pp.picCodingType == 0 && (p_hal->first_field == 0)))) {
      pRVar2[3] = pRVar2[3] & 0xffffefff | 0x1000;
    }
  }
  else if (((p_hal->syn).pp.picCodingType == 1) || ((p_hal->syn).pp.picCodingType == 0)) {
    pRVar2[3] = pRVar2[3] & 0xffffefff | 0x1000;
  }
  if ((p_hal->first_field == 0) &&
     (((p_hal->syn).pp.picCodingType != 2 || (p_hal->prev_pic_structure == 0)))) {
    RVar4 = (p_hal->syn).pp.horizontalSize;
    if ((p_hal->syn).pp.progressiveFrame == 0) {
      pic_type = ((p_hal->syn).pp.verticalSize + 0x1f >> 5) << 1;
    }
    else {
      pic_type = (p_hal->syn).pp.verticalSize + 0xf >> 4;
    }
    RVar6 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar2[0x29] = RVar6;
    mpp_dev_set_reg_offset
              (p_hal->dev,0x29,(((RVar4 + 0xf >> 4) * pic_type >> 1) + 1 & 0xfffffffe) << 4);
  }
  else {
    RVar4 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar2[0x29] = RVar4;
  }
  if ((pRVar2[0x2c] >> 0x1a & 1) != 0) {
    RVar4 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar2[0x2d] = RVar4;
  }
  local_70 = 0;
  if (-1 < p_hal->work0) {
    local_70 = p_hal->pic[p_hal->work0].pic_type;
  }
  local_85 = 1;
  if (local_70 != 0) {
    local_86 = 0;
    if (p_hal->first_field == 0) {
      local_86 = p_hal->prev_pic_structure != 0 ^ 0xff;
    }
    local_85 = local_86;
  }
  pRVar2[0x12] = pRVar2[0x12] & 0xfffffffe | (uint)(local_85 & 1);
  if (p_hal->prev_pic_structure == 0) {
    mpp_dev_set_reg_offset(p_hal->dev,0x10,2);
    mpp_dev_set_reg_offset(p_hal->dev,0x11,3);
  }
  pRVar2[3] = pRVar2[3] & 0xffff7fff;
  pRVar2[1] = pRVar2[1] & 0xfffffffe | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET set_regs_parameters(AvsdHalCtx_t *p_hal, HalDecTask *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    AvsdSyntax_t *p_syn = &p_hal->syn;
    AvsdPlusRegs_t *p_regs = (AvsdPlusRegs_t *)p_hal->p_regs;

    p_regs->sw02.dec_timeout_e = 1;

    //!< set wrok_out pic info
    if (p_hal->work_out < 0) {
        p_hal->work_out = get_queue_pic(p_hal);
        if (p_hal->work_out < 0) {
            ret = MPP_NOK;
            mpp_err_f("cannot get a pic_info buffer.\n");
            goto __FAILED;
        }
    }
    {
        AvsdHalPic_t *p_work_out = &p_hal->pic[p_hal->work_out];

        p_work_out->slot_idx = task->output;
        p_work_out->pic_code_type = p_syn->pp.picCodingType;
        p_work_out->picture_distance = p_syn->pp.pictureDistance;
    }
    //!< set register
    set_defalut_parameters(p_hal);
    p_regs->sw04.pic_mb_width = (p_syn->pp.horizontalSize + 15) >> 4;
    p_regs->sw03.dec_mode = 11; //!< DEC_MODE_AVS

    if (p_syn->pp.pictureStructure == FRAMEPICTURE) {
        p_regs->sw03.pic_interlace_e = 0;
        p_regs->sw03.pic_fieldmode_e = 0;
        p_regs->sw03.pic_topfiled_e = 0;
    } else {
        p_regs->sw03.pic_interlace_e = 1;
        p_regs->sw03.pic_fieldmode_e = 1;
        if (p_syn->pp.topFieldFirst) {
            p_regs->sw03.pic_topfiled_e = p_hal->first_field;
        } else {
            p_regs->sw03.pic_topfiled_e = !p_hal->first_field;
        }
    }

    p_regs->sw04.pic_mb_height_p = (p_syn->pp.verticalSize + 15) >> 4;
    p_regs->sw07.avs_h_ext = (p_syn->pp.verticalSize + 15) >> 12;

    if (p_syn->pp.picCodingType == BFRAME) {
        p_regs->sw03.pic_b_e = 1;
    } else {
        p_regs->sw03.pic_b_e = 0;
    }
    p_regs->sw03.pic_inter_e = (p_syn->pp.picCodingType != IFRAME) ? 1 : 0;

    p_regs->sw05.strm_start_bit = 8 * (p_hal->data_offset & 0x7);
    p_hal->data_offset = (p_hal->data_offset & ~0x7);
    p_regs->sw12.rlc_vlc_base = get_packet_fd(p_hal, task->input);
    mpp_dev_set_reg_offset(p_hal->dev, 12, p_hal->data_offset);
    p_regs->sw06.stream_len = p_syn->bitstream_size - p_hal->data_offset;

    p_regs->sw03.pic_fixed_quant = p_syn->pp.fixedPictureQp;
    p_regs->sw06.init_qp = p_syn->pp.pictureQp;
    //!< AVS Plus stuff
    if (p_syn->pp.profileId == 0x48) {
        p_regs->sw44.dec_avsp_ena = 1;
    } else {
        p_regs->sw44.dec_avsp_ena = 0;
    }
    if (p_regs->sw44.dec_avsp_ena) {
        p_regs->sw44.weight_qp_e = p_syn->pp.weightingQuantFlag;
        p_regs->sw44.avs_aec_e = p_syn->pp.aecEnable;
        p_regs->sw44.no_fwd_ref_e = p_syn->pp.noForwardReferenceFlag;
        p_regs->sw44.pb_field_enhance_e = p_syn->pp.pbFieldEnhancedFlag;

        if (p_syn->pp.weightingQuantFlag
            && !p_syn->pp.chromaQuantParamDisable) {
            p_regs->sw44.qp_delta_cb = p_syn->pp.chromaQuantParamDeltaCb;
            p_regs->sw44.qp_delta_cr = p_syn->pp.chromaQuantParamDeltaCr;
        } else {
            p_regs->sw44.qp_delta_cb = 0;
            p_regs->sw44.qp_delta_cr = 0;
        }
        if (p_syn->pp.weightingQuantFlag) {
            p_regs->sw44.weight_qp_model = p_syn->pp.weightingQuantModel;
            p_regs->sw44.weight_qp_0 = p_syn->pp.weightingQuantParam[0];
            p_regs->sw42.weight_qp_1 = p_syn->pp.weightingQuantParam[1];
            p_regs->sw43.weight_qp_2 = p_syn->pp.weightingQuantParam[2];
            p_regs->sw43.weight_qp_3 = p_syn->pp.weightingQuantParam[3];
            p_regs->sw43.weight_qp_4 = p_syn->pp.weightingQuantParam[4];
            p_regs->sw43.weight_qp_5 = p_syn->pp.weightingQuantParam[5];
        }
    }
    //!< AVS Plus end
    if (p_syn->pp.pictureStructure == FRAMEPICTURE || p_hal->first_field) {
        p_regs->sw13.dec_out_base = get_frame_fd(p_hal, task->output);
    } else {
        //!< start of bottom field line
        RK_U32 stride = p_syn->pp.horizontalSize;

        p_regs->sw13.dec_out_base = get_frame_fd(p_hal, task->output);
        mpp_dev_set_reg_offset(p_hal->dev, 13, stride);
    }
    {
        RK_S32 tmp_fwd = -1;
        RK_S32 refer0 = -1;
        RK_S32 refer1 = -1;

        tmp_fwd = (p_hal->work1 < 0) ? p_hal->work0 : p_hal->work1;
        tmp_fwd = (tmp_fwd < 0) ? p_hal->work_out : tmp_fwd;

        refer0 = (task->refer[0] < 0) ? task->output : task->refer[0];
        refer1 = (task->refer[1] < 0) ? refer0 : task->refer[1];
        if (!p_hal->first_field
            && p_syn->pp.pictureStructure == FIELDPICTURE
            && p_syn->pp.picCodingType != BFRAME) {
            p_regs->sw14.refer0_base = get_frame_fd(p_hal, task->output);
            p_regs->sw15.refer1_base = get_frame_fd(p_hal, refer0);
            p_regs->sw16.refer2_base = get_frame_fd(p_hal, refer0);
            p_regs->sw17.refer3_base = get_frame_fd(p_hal, refer1);
        } else {
            p_regs->sw14.refer0_base = get_frame_fd(p_hal, refer0);
            p_regs->sw15.refer1_base = get_frame_fd(p_hal, refer0);
            p_regs->sw16.refer2_base = get_frame_fd(p_hal, refer1);
            p_regs->sw17.refer3_base = get_frame_fd(p_hal, refer1);
        }
    }
    //!< block distances
    if (p_syn->pp.pictureStructure == FRAMEPICTURE) {
        if (p_syn->pp.picCodingType == BFRAME) {
            RK_S32 tmp = 0;
            //!< current to future anchor
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_syn->pp.pictureDistance + 512) & 0x1FF;
            }
            //!< prevent division by zero
            if (!tmp) tmp = 2;
            p_regs->sw31.ref_dist_cur_2 = tmp;
            p_regs->sw31.ref_dist_cur_3 = tmp;
            p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
            p_regs->sw29.ref_invd_cur_3 = 512 / tmp;

            //!< current to past anchor
            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            p_regs->sw30.ref_dist_cur_0 = tmp;
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            //!< future anchor to past anchor
            if (p_hal->work0 >= 0 && p_hal->work1 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            tmp = 16384 / tmp;
            p_regs->sw32.ref_invd_col_0 = tmp;
            p_regs->sw32.ref_invd_col_1 = tmp;
            //!< future anchor to previous past anchor
            tmp = p_hal->future2prev_past_dist;
            tmp = 16384 / tmp;
            p_regs->sw33.ref_invd_col_2 = tmp;
            p_regs->sw33.ref_invd_col_3 = tmp;
        } else {
            RK_S32 tmp = 0;
            //!< current to past anchor
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work0].picture_distance - 512) & 0x1FF;
            }
            if (!tmp) tmp = 2;
            p_regs->sw30.ref_dist_cur_0 = tmp;
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            //!< current to previous past anchor
            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< this will become "future to previous past" for next B
            p_hal->future2prev_past_dist = tmp;

            p_regs->sw31.ref_dist_cur_2 = tmp;
            p_regs->sw31.ref_dist_cur_3 = tmp;
            p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
            p_regs->sw29.ref_invd_cur_3 = 512 / tmp;

            p_regs->sw32.ref_invd_col_0 = 0;
            p_regs->sw32.ref_invd_col_1 = 0;
            p_regs->sw33.ref_invd_col_2 = 0;
            p_regs->sw33.ref_invd_col_3 = 0;
        }
    } else {
        //!< field interlaced
        if (p_syn->pp.picCodingType == BFRAME) {
            RK_S32 tmp = 0;
            //!< block distances
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_syn->pp.pictureDistance + 512) & 0x1FF;
            }
            //!< prevent division by zero
            if (!tmp) tmp = 2;

            if (p_hal->first_field) {
                p_regs->sw31.ref_dist_cur_2 = tmp;
                p_regs->sw31.ref_dist_cur_3 = tmp + 1;
                p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
                p_regs->sw29.ref_invd_cur_3 = 512 / (tmp + 1);
            } else {
                p_regs->sw31.ref_dist_cur_2 = tmp - 1;
                p_regs->sw31.ref_dist_cur_3 = tmp;
                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp - 1);
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            }

            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            if (p_hal->first_field) {
                p_regs->sw30.ref_dist_cur_0 = (tmp - 1);
                p_regs->sw30.ref_dist_cur_1 = tmp;
                p_regs->sw28.ref_invd_cur_0 = 512 / (tmp - 1);
                p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            } else {
                p_regs->sw30.ref_dist_cur_0 = tmp;
                p_regs->sw30.ref_dist_cur_1 = tmp + 1;
                p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
                p_regs->sw28.ref_invd_cur_1 = 512 / (tmp + 1);
            }

            if (p_hal->work0 >= 0 && p_hal->work1 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< AVS Plus stuff
            if (p_syn->pp.pbFieldEnhancedFlag && !p_hal->first_field) {
                //!< in this case, BlockDistanceRef is different with before, the mvRef points to top field
                p_regs->sw32.ref_invd_col_0 = 16384 / (tmp - 1);
                p_regs->sw32.ref_invd_col_1 = 16384 / tmp;

                //!< future anchor to previous past anchor
                tmp = p_hal->future2prev_past_dist;

                p_regs->sw33.ref_invd_col_2 = 16384 / (tmp - 1);
                p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
            } else {
                if (p_hal->first_field) {
                    p_regs->sw32.ref_invd_col_0 = 16384 / (tmp - 1);
                    p_regs->sw32.ref_invd_col_1 = 16384 / tmp;
                } else {
                    p_regs->sw32.ref_invd_col_0 = 16384;
                    p_regs->sw32.ref_invd_col_1 = 16384 / tmp;
                    p_regs->sw33.ref_invd_col_2 = 16384 / (tmp + 1);
                }

                //!< future anchor to previous past anchor
                tmp = p_hal->future2prev_past_dist;

                if (p_hal->first_field) {
                    p_regs->sw33.ref_invd_col_2 = 16384 / (tmp - 1);
                    p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
                } else {
                    p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
                }
            }
        } else {
            RK_S32 tmp = 0;
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work0].picture_distance - 512) & 0x1FF;
            }
            if (!tmp) tmp = 2;

            if (!p_hal->first_field) {
                p_regs->sw30.ref_dist_cur_0 = 1;
                p_regs->sw31.ref_dist_cur_2 = tmp + 1;

                p_regs->sw28.ref_invd_cur_0 = 512;
                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp + 1);
            } else {
                p_regs->sw30.ref_dist_cur_0 = tmp - 1;
                p_regs->sw28.ref_invd_cur_0 = 512 / (tmp - 1);
            }
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;

            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< this will become "future to previous past" for next B
            p_hal->future2prev_past_dist = tmp;
            if (p_hal->first_field) {
                p_regs->sw31.ref_dist_cur_2 = tmp - 1;
                p_regs->sw31.ref_dist_cur_3 = tmp;

                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp - 1);
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            } else {
                p_regs->sw31.ref_dist_cur_3 = tmp;
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            }

            p_regs->sw32.ref_invd_col_0 = 0;
            p_regs->sw32.ref_invd_col_1 = 0;
            p_regs->sw33.ref_invd_col_2 = 0;
            p_regs->sw33.ref_invd_col_3 = 0;
        }
    }
    //!< AVS Plus stuff
    if (p_regs->sw44.dec_avsp_ena) {
        p_regs->sw42.ref_delta_col_0 = 0;
        p_regs->sw42.ref_delta_col_1 = 0;
        p_regs->sw42.ref_delta_col_2 = 0;
        p_regs->sw42.ref_delta_col_3 = 0;
        p_regs->sw42.ref_delta_cur_0 = 0;
        p_regs->sw42.ref_delta_cur_1 = 0;
        p_regs->sw42.ref_delta_cur_2 = 0;
        p_regs->sw42.ref_delta_cur_3 = 0;
        if (p_syn->pp.pictureStructure == FIELDPICTURE
            && p_syn->pp.picCodingType == BFRAME) {
            //!< 1 means delta=2, 3 means delta=-2, 0 means delta=0
            //!< delta1
            p_regs->sw42.ref_delta_col_0 = 2;
            p_regs->sw42.ref_delta_col_1 = 0;
            p_regs->sw42.ref_delta_col_2 = 2;
            p_regs->sw42.ref_delta_col_3 = 0;
            if (p_hal->first_field) {
                //!< deltaFw
                p_regs->sw42.ref_delta_cur_0 = 2;
                p_regs->sw42.ref_delta_cur_1 = 0;
                //!< deltaBw
                p_regs->sw42.ref_delta_cur_2 = 0;
                p_regs->sw42.ref_delta_cur_3 = 0;
            } else {
                //!< deltaFw
                p_regs->sw42.ref_delta_cur_0 = 0;
                p_regs->sw42.ref_delta_cur_1 = 0;
                //!< deltaBw
                p_regs->sw42.ref_delta_cur_2 = 6; //!< (RK_U32)-2
                p_regs->sw42.ref_delta_cur_3 = 6; //!< (RK_U32)-2
            }
        }
    }
    //!< AVS Plus end

    p_regs->sw48.startmb_x = 0;
    p_regs->sw48.startmb_y = 0;

    p_regs->sw03.filtering_dis = p_syn->pp.loopFilterDisable;
    p_regs->sw05.alpha_offset = p_syn->pp.alphaOffset;
    p_regs->sw05.beta_offset = p_syn->pp.betaOffset;
    p_regs->sw03.skip_mode = p_syn->pp.skipModeFlag;
    p_regs->sw04.pic_refer_flag = p_syn->pp.pictureReferenceFlag;

    //!< AVS Plus change
    p_regs->sw03.write_mvs_e = 0;
    if (p_regs->sw44.dec_avsp_ena) {
        if (p_syn->pp.picCodingType == PFRAME
            || p_syn->pp.picCodingType == IFRAME) {
            p_regs->sw03.write_mvs_e = 1;
        }
    } else {
        if (p_syn->pp.picCodingType == PFRAME
            || (p_syn->pp.picCodingType == IFRAME && !p_hal->first_field)) {
            p_regs->sw03.write_mvs_e = 1;
        }
    }
    //!< AVS Plus end
    //!< set mv base
    if (p_hal->first_field ||
        (p_syn->pp.picCodingType == BFRAME && p_hal->prev_pic_structure)) {
        p_regs->sw41.dir_mv_base = mpp_buffer_get_fd(p_hal->mv_buf);
    } else {
        RK_U32 frame_width = 0, frame_height = 0, offset = 0;
        frame_width = (p_syn->pp.horizontalSize + 15) >> 4;
        if (p_syn->pp.progressiveFrame)
            frame_height = (p_syn->pp.verticalSize + 15) >> 4;
        else
            frame_height = 2 * ((p_syn->pp.verticalSize + 31) >> 5);
        offset = MPP_ALIGN(frame_width * frame_height / 2, 2) * 16;
        p_regs->sw41.dir_mv_base = mpp_buffer_get_fd(p_hal->mv_buf);
        mpp_dev_set_reg_offset(p_hal->dev, 41, offset);
    }
    //!< AVS Plus stuff
    if (p_regs->sw44.dec_avsp_ena) {
        p_regs->sw45.dir_mv_base2 = mpp_buffer_get_fd(p_hal->mv_buf);
    }
    //!< AVS Plus end
    {
        RK_U32 pic_type = 0;
        RK_U32 prev_anc_type = 0;

        if (p_hal->work0 >= 0) {
            pic_type = p_hal->pic[p_hal->work0].pic_type;
        }
        prev_anc_type = !pic_type || (!p_hal->first_field && !p_hal->prev_pic_structure);
        p_regs->sw18.prev_anc_type = prev_anc_type;
    }
    //!< b-picture needs to know if future reference is field or frame coded
    // p_regs->sw16.refer2_field_e = (!p_hal->prev_pic_structure) ? 1 : 0;
    // p_regs->sw17.refer3_field_e = (!p_hal->prev_pic_structure) ? 1 : 0;
    if (!p_hal->prev_pic_structure) {
        mpp_dev_set_reg_offset(p_hal->dev, 16, 2);
        mpp_dev_set_reg_offset(p_hal->dev, 17, 3);
    }

    p_regs->sw03.dec_out_dis = 0;
    p_regs->sw01.dec_e = 1;

    return MPP_OK;
__FAILED:
    return ret;
}